

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

void assignStringSymbol(Symbol *sym,char *value)

{
  char *pcVar1;
  size_t sVar2;
  int *piVar3;
  
  pcVar1 = strdup(value);
  if (pcVar1 != (char *)0x0) {
    sym->type = SYM_EQUS;
    (sym->field_8).field_2.macro = pcVar1;
    sVar2 = strlen(pcVar1);
    (sym->field_8).field_2.macroSize = sVar2;
    return;
  }
  piVar3 = __errno_location();
  pcVar1 = strerror(*piVar3);
  fatalerror("No memory for string equate: %s\n",pcVar1);
}

Assistant:

static void assignStringSymbol(struct Symbol *sym, char const *value)
{
	char *string = strdup(value);

	if (!string)
		fatalerror("No memory for string equate: %s\n", strerror(errno));

	sym->type = SYM_EQUS;
	sym->macro = string;
	sym->macroSize = strlen(string);
}